

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O2

uint64_t kratos::eval_unary_op(uint64_t value,ExprOp op,uint32_t width)

{
  uint uVar1;
  runtime_error *this;
  byte bVar2;
  
  bVar2 = (byte)width;
  switch(op) {
  case UInvert:
    value = ~(-1L << (bVar2 & 0x3f) ^ value);
    break;
  case UMinus:
    value = (-(-1L << (bVar2 & 0x3f) ^ value) << (-bVar2 & 0x3f)) >> (-bVar2 & 0x3f);
    break;
  case UPlus:
    break;
  case UOr:
    value = (uint64_t)(value != 0);
    break;
  case UNot:
    value = (uint64_t)(value == 0);
    break;
  case UAnd:
    uVar1 = (uint)value - ((uint)(value >> 1) & 0x55555555);
    uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
    value = (uint64_t)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f) * 0x1010101 >> 0x18 == width);
    break;
  case UXor:
    uVar1 = (uint)(value >> 0x10) & 0xffff ^ (uint)value;
    value = (uint64_t)((POPCOUNT((byte)uVar1 ^ (byte)(uVar1 >> 8)) & 1U) != 0);
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return value;
}

Assistant:

uint64_t eval_unary_op(uint64_t value, ExprOp op, uint32_t width) {
    switch(op) {
        case ExprOp::UMinus:
            return two_complement(value, width);
        case ExprOp::UAnd:
            return static_cast<uint32_t>(__builtin_popcount(value)) == width;
        case ExprOp::UInvert:
            return invert(value, width);
        case ExprOp::UNot:
             return !value;
        case ExprOp::UOr:
            return (bool)(value);
        case ExprOp::UPlus:
            return value;
        case ExprOp::UXor: {
            return __builtin_popcount(value) % 2;
        }
        default: throw std::runtime_error("Not implemented");
    }
}